

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreducedspace.cpp
# Opt level: O3

int __thiscall TPZReducedSpace::NConnectShapeF(TPZReducedSpace *this,int inod,int order)

{
  long lVar1;
  
  lVar1 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xa8))
                    (this,0);
  return *(int *)(lVar1 + 0x18);
}

Assistant:

int TPZReducedSpace::NConnectShapeF(int inod, int order) const
{
#ifdef PZDEBUG
    if (inod != 0) {
        DebugStop();
    }
#endif
    TPZConnect &c = Connect(0);
    return c.NShape();
}